

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O2

int VP8GetCostLuma4(VP8EncIterator *it,int16_t *levels)

{
  int iVar1;
  VP8Encoder *pVVar2;
  int iVar3;
  VP8Residual res;
  VP8Residual local_40;
  
  pVVar2 = it->enc_;
  local_40.coeff_type = 3;
  local_40.prob = (pVVar2->proba_).coeffs_[3];
  local_40.stats = (pVVar2->proba_).stats_[3];
  local_40.costs = (pVVar2->proba_).remapped_costs_[3];
  local_40.first = 0;
  iVar3 = it->left_nz_[it->i4_ >> 2];
  iVar1 = it->top_nz_[it->i4_ & 3];
  (*VP8SetResidualCoeffs)(levels,&local_40);
  iVar3 = (*VP8GetResidualCost)(iVar3 + iVar1,&local_40);
  return iVar3;
}

Assistant:

int VP8GetCostLuma4(VP8EncIterator* const it, const int16_t levels[16]) {
  const int x = (it->i4_ & 3), y = (it->i4_ >> 2);
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int R = 0;
  int ctx;

  VP8InitResidual(0, 3, enc, &res);
  ctx = it->top_nz_[x] + it->left_nz_[y];
  VP8SetResidualCoeffs(levels, &res);
  R += VP8GetResidualCost(ctx, &res);
  return R;
}